

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
insert<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::StringPtr&>
          (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> *this,
          ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table,size_t pos,
          StringPtr *params)

{
  ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table_00;
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  WiderType<Decay<unsigned_long>,_Decay<unsigned_long>_> targetSize;
  Entry *e;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this_00;
  StringPtr *in_R9;
  Maybe<unsigned_long> MVar6;
  ulong local_98;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *local_90;
  Entry *local_88;
  HashBucket local_80;
  HashBucket local_78;
  HashBucket *local_70;
  HashBucket *s;
  HashBucket *bucket;
  uint i;
  Maybe<kj::_::HashBucket_&> erasedSlot;
  unsigned_long uStack_48;
  uint hashCode;
  unsigned_long local_40;
  StringPtr *local_38;
  StringPtr *params_local;
  size_t pos_local;
  HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *this_local;
  ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table_local;
  
  this_local = (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *)table.size_;
  this_00 = (HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks> *)table.ptr;
  local_38 = in_R9;
  params_local = params;
  pos_local = (size_t)this_00;
  table_local.ptr = (Entry *)pos;
  table_local.size_ = (size_t)this;
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  sVar4 = ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::size
                    ((ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)&this_local);
  if (sVar3 << 1 < (sVar4 + 1 + this_00->erasedCount) * 3) {
    sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
    local_40 = sVar3 << 1;
    sVar3 = ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry>::size
                      ((ArrayPtr<kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> *)&this_local);
    uStack_48 = (sVar3 + 1) * 2;
    targetSize = max<unsigned_long,unsigned_long>(&local_40,&stack0xffffffffffffffb8);
    HashIndex<kj::HashMap<kj::StringPtr,_unsigned_short>::Callbacks>::rehash(this_00,targetSize);
  }
  bVar1 = HashMap<kj::StringPtr,unsigned_short>::Callbacks::hashCode<kj::StringPtr&>
                    ((Callbacks *)this_00,local_38);
  erasedSlot.ptr._4_4_ = (uint)bVar1;
  Maybe<kj::_::HashBucket_&>::Maybe((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
  uVar2 = erasedSlot.ptr._4_4_;
  sVar3 = Array<kj::_::HashBucket>::size(&this_00->buckets);
  bucket._4_4_ = kj::_::chooseBucket(uVar2,(uint)sVar3);
  do {
    s = Array<kj::_::HashBucket>::operator[](&this_00->buckets,(ulong)bucket._4_4_);
    bVar1 = kj::_::HashBucket::isEmpty(s);
    if (bVar1) {
      local_70 = kj::_::readMaybe<kj::_::HashBucket>
                           ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8);
      if (local_70 == (HashBucket *)0x0) {
        kj::_::HashBucket::HashBucket(&local_80,erasedSlot.ptr._4_4_,(uint)params_local);
        *s = local_80;
      }
      else {
        this_00->erasedCount = this_00->erasedCount - 1;
        kj::_::HashBucket::HashBucket(&local_78,erasedSlot.ptr._4_4_,(uint)params_local);
        *local_70 = local_78;
      }
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,(void *)0x0);
      aVar5 = extraout_RDX;
LAB_0044f154:
      MVar6.ptr.field_1.value = aVar5.value;
      MVar6.ptr._0_8_ = this;
      return (Maybe<unsigned_long>)MVar6.ptr;
    }
    bVar1 = kj::_::HashBucket::isErased(s);
    if (bVar1) {
      bVar1 = Maybe<kj::_::HashBucket_&>::operator==
                        ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8,(void *)0x0);
      if (bVar1) {
        Maybe<kj::_::HashBucket_&>::operator=
                  ((Maybe<kj::_::HashBucket_&> *)&stack0xffffffffffffffa8,s);
      }
    }
    else if (s->hash == erasedSlot.ptr._4_4_) {
      local_90 = this_local;
      local_88 = table_local.ptr;
      table_00.size_ = (size_t)table_local.ptr;
      table_00.ptr = (Entry *)this_local;
      e = kj::_::HashBucket::getRow<kj::HashMap<kj::StringPtr,unsigned_short>::Entry>(s,table_00);
      bVar1 = HashMap<kj::StringPtr,unsigned_short>::Callbacks::matches<kj::StringPtr&>
                        ((Callbacks *)this_00,e,local_38);
      if (bVar1) {
        uVar2 = kj::_::HashBucket::getPos(s);
        local_98 = (ulong)uVar2;
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_98);
        aVar5 = extraout_RDX_00;
        goto LAB_0044f154;
      }
    }
    sVar3 = kj::_::probeHash(&this_00->buckets,(ulong)bucket._4_4_);
    bucket._4_4_ = (uint)sVar3;
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }